

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

void IntraChromaPreds_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  ulong *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [13];
  undefined1 auVar22 [15];
  undefined1 auVar23 [11];
  undefined1 auVar24 [13];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint uVar29;
  uint uVar30;
  uint8_t *puVar31;
  ulong *puVar32;
  int j;
  long lVar33;
  int j_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  short sVar46;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar47 [16];
  short sVar55;
  undefined1 auVar48 [16];
  undefined1 uVar44;
  undefined1 uVar45;
  
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      lVar33 = 0;
      do {
        puVar31 = dst + lVar33 + 0x400;
        puVar31[0] = 0x80;
        puVar31[1] = 0x80;
        puVar31[2] = 0x80;
        puVar31[3] = 0x80;
        puVar31[4] = 0x80;
        puVar31[5] = 0x80;
        puVar31[6] = 0x80;
        puVar31[7] = 0x80;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
    else {
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)left;
      auVar34 = psadbw((undefined1  [16])0x0,auVar34);
      uVar29 = auVar34._0_4_ + 4;
      uVar30 = uVar29 >> 3;
      bVar4 = (byte)(uVar29 >> 0x18);
      uVar45 = (undefined1)(uVar30 >> 0x10);
      uVar44 = (undefined1)(uVar30 >> 8);
      auVar36._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(bVar4 >> 3,bVar4 >> 3),uVar45),CONCAT14(uVar45,uVar30))
                >> 0x20);
      auVar36[3] = uVar44;
      auVar36[2] = uVar44;
      auVar36[0] = (undefined1)uVar30;
      auVar36[1] = auVar36[0];
      auVar36._8_8_ = 0;
      auVar34 = pshuflw(auVar36,auVar36,0);
      lVar33 = 0;
      do {
        *(long *)(dst + lVar33 + 0x400) = auVar34._0_8_;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
  }
  else if (left == (uint8_t *)0x0) {
    auVar37._8_8_ = 0;
    auVar37._0_8_ = *(ulong *)top;
    auVar34 = psadbw((undefined1  [16])0x0,auVar37);
    uVar29 = auVar34._0_4_ + 4;
    uVar30 = uVar29 >> 3;
    bVar4 = (byte)(uVar29 >> 0x18);
    uVar45 = (undefined1)(uVar30 >> 0x10);
    uVar44 = (undefined1)(uVar30 >> 8);
    auVar38._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar4 >> 3,bVar4 >> 3),uVar45),CONCAT14(uVar45,uVar30)) >>
              0x20);
    auVar38[3] = uVar44;
    auVar38[2] = uVar44;
    auVar38[0] = (undefined1)uVar30;
    auVar38[1] = auVar38[0];
    auVar38._8_8_ = 0;
    auVar34 = pshuflw(auVar38,auVar38,0);
    lVar33 = 0;
    do {
      *(long *)(dst + lVar33 + 0x400) = auVar34._0_8_;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  else {
    auVar47._8_8_ = *(undefined8 *)left;
    auVar47._0_8_ = *(undefined8 *)top;
    auVar34 = psadbw((undefined1  [16])0x0,auVar47);
    uVar29 = auVar34._8_4_ + auVar34._0_4_ + 8;
    uVar30 = uVar29 >> 4;
    bVar4 = (byte)(uVar29 >> 0x18);
    uVar45 = (undefined1)(uVar30 >> 0x10);
    uVar44 = (undefined1)(uVar30 >> 8);
    auVar35._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar4 >> 4,bVar4 >> 4),uVar45),CONCAT14(uVar45,uVar30)) >>
              0x20);
    auVar35[3] = uVar44;
    auVar35[2] = uVar44;
    auVar35[0] = (undefined1)uVar30;
    auVar35[1] = auVar35[0];
    auVar35._8_8_ = 0;
    auVar34 = pshuflw(auVar35,auVar35,0);
    lVar33 = 0;
    do {
      *(long *)(dst + lVar33 + 0x400) = auVar34._0_8_;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  if (top == (uint8_t *)0x0) {
    lVar33 = 0;
    do {
      builtin_memcpy(dst + lVar33 + 0x500,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  else {
    uVar5 = *(undefined8 *)top;
    lVar33 = 0;
    do {
      *(undefined8 *)(dst + lVar33 + 0x500) = uVar5;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  puVar31 = dst + 0x510;
  if (left == (uint8_t *)0x0) {
    lVar33 = 0;
    do {
      puVar2 = puVar31 + lVar33;
      puVar2[0] = 0x81;
      puVar2[1] = 0x81;
      puVar2[2] = 0x81;
      puVar2[3] = 0x81;
      puVar2[4] = 0x81;
      puVar2[5] = 0x81;
      puVar2[6] = 0x81;
      puVar2[7] = 0x81;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
    if (top == (uint8_t *)0x0) {
      lVar33 = 0;
      do {
        puVar31 = dst + lVar33 + 0x410;
        puVar31[0] = 0x81;
        puVar31[1] = 0x81;
        puVar31[2] = 0x81;
        puVar31[3] = 0x81;
        puVar31[4] = 0x81;
        puVar31[5] = 0x81;
        puVar31[6] = 0x81;
        puVar31[7] = 0x81;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
    else {
      uVar5 = *(undefined8 *)top;
      lVar33 = 0;
      do {
        *(undefined8 *)(dst + lVar33 + 0x410) = uVar5;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
  }
  else {
    lVar33 = 0;
    do {
      auVar34 = ZEXT216(CONCAT11(left[lVar33],left[lVar33]));
      auVar34 = pshuflw(auVar34,auVar34,0);
      *(long *)puVar31 = auVar34._0_8_;
      puVar31 = puVar31 + 0x20;
      lVar33 = lVar33 + 1;
    } while (lVar33 != 8);
    puVar31 = dst + 0x410;
    if (top == (uint8_t *)0x0) {
      lVar33 = 0;
      do {
        auVar34 = ZEXT216(CONCAT11(left[lVar33],left[lVar33]));
        auVar34 = pshuflw(auVar34,auVar34,0);
        *(long *)puVar31 = auVar34._0_8_;
        puVar31 = puVar31 + 0x20;
        lVar33 = lVar33 + 1;
      } while (lVar33 != 8);
    }
    else {
      uVar3 = *(ulong *)top;
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar3;
      auVar6[0xe] = (char)(uVar3 >> 0x38);
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar3;
      auVar8[0xc] = (char)(uVar3 >> 0x30);
      auVar8._13_2_ = auVar6._13_2_;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar3;
      auVar10._12_3_ = auVar8._12_3_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar3;
      auVar12[10] = (char)(uVar3 >> 0x28);
      auVar12._11_4_ = auVar10._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar3;
      auVar14._10_5_ = auVar12._10_5_;
      auVar16[8] = (char)(uVar3 >> 0x20);
      auVar16._0_8_ = uVar3;
      auVar16._9_6_ = auVar14._9_6_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar16._8_7_;
      Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var19;
      auVar20._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar20[0] = (char)(uVar3 >> 0x10);
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar20;
      auVar21._1_12_ = SUB1512(auVar26 << 0x20,3);
      auVar21[0] = (char)(uVar3 >> 8);
      bVar4 = left[-1];
      lVar33 = 0;
      do {
        auVar34 = pshuflw(ZEXT416((uint)left[lVar33] - (uint)bVar4),
                          ZEXT416((uint)left[lVar33] - (uint)bVar4),0);
        sVar54 = auVar34._0_2_;
        sVar46 = sVar54 + (ushort)(byte)uVar3;
        sVar55 = auVar34._2_2_;
        sVar49 = sVar55 + auVar21._0_2_;
        sVar50 = sVar54 + auVar20._0_2_;
        sVar51 = sVar55 + (short)Var19;
        sVar52 = sVar54 + auVar16._8_2_;
        sVar53 = sVar55 + auVar12._10_2_;
        sVar54 = sVar54 + auVar8._12_2_;
        sVar55 = sVar55 + (auVar6._13_2_ >> 8);
        *(ulong *)puVar31 =
             CONCAT17((0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55),
                      CONCAT16((0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54),
                               CONCAT15((0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 -
                                        (0xff < sVar53),
                                        CONCAT14((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 -
                                                 (0xff < sVar52),
                                                 CONCAT13((0 < sVar51) * (sVar51 < 0x100) *
                                                          (char)sVar51 - (0xff < sVar51),
                                                          CONCAT12((0 < sVar50) * (sVar50 < 0x100) *
                                                                   (char)sVar50 - (0xff < sVar50),
                                                                   CONCAT11((0 < sVar49) *
                                                                            (sVar49 < 0x100) *
                                                                            (char)sVar49 -
                                                                            (0xff < sVar49),
                                                                            (0 < sVar46) *
                                                                            (sVar46 < 0x100) *
                                                                            (char)sVar46 -
                                                                            (0xff < sVar46))))))));
        lVar33 = lVar33 + 1;
        puVar31 = puVar31 + 0x20;
      } while (lVar33 != 8);
    }
  }
  puVar1 = (ulong *)(left + 0x10);
  puVar32 = puVar1;
  if (left == (uint8_t *)0x0) {
    puVar32 = (ulong *)0x0;
  }
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      lVar33 = 0;
      do {
        puVar31 = dst + lVar33 + 0x408;
        puVar31[0] = 0x80;
        puVar31[1] = 0x80;
        puVar31[2] = 0x80;
        puVar31[3] = 0x80;
        puVar31[4] = 0x80;
        puVar31[5] = 0x80;
        puVar31[6] = 0x80;
        puVar31[7] = 0x80;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
    else {
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *puVar1;
      auVar34 = psadbw((undefined1  [16])0x0,auVar40);
      uVar29 = auVar34._0_4_ + 4;
      uVar30 = uVar29 >> 3;
      bVar4 = (byte)(uVar29 >> 0x18);
      uVar45 = (undefined1)(uVar30 >> 0x10);
      uVar44 = (undefined1)(uVar30 >> 8);
      auVar41._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(bVar4 >> 3,bVar4 >> 3),uVar45),CONCAT14(uVar45,uVar30))
                >> 0x20);
      auVar41[3] = uVar44;
      auVar41[2] = uVar44;
      auVar41[0] = (undefined1)uVar30;
      auVar41[1] = auVar41[0];
      auVar41._8_8_ = 0;
      auVar34 = pshuflw(auVar41,auVar41,0);
      lVar33 = 0;
      do {
        *(long *)(dst + lVar33 + 0x408) = auVar34._0_8_;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
  }
  else if (left == (uint8_t *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)(top + 8);
    auVar34 = psadbw((undefined1  [16])0x0,auVar42);
    uVar29 = auVar34._0_4_ + 4;
    uVar30 = uVar29 >> 3;
    bVar4 = (byte)(uVar29 >> 0x18);
    uVar45 = (undefined1)(uVar30 >> 0x10);
    uVar44 = (undefined1)(uVar30 >> 8);
    auVar43._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar4 >> 3,bVar4 >> 3),uVar45),CONCAT14(uVar45,uVar30)) >>
              0x20);
    auVar43[3] = uVar44;
    auVar43[2] = uVar44;
    auVar43[0] = (undefined1)uVar30;
    auVar43[1] = auVar43[0];
    auVar43._8_8_ = 0;
    auVar34 = pshuflw(auVar43,auVar43,0);
    lVar33 = 0;
    do {
      *(long *)(dst + lVar33 + 0x408) = auVar34._0_8_;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  else {
    auVar48._8_8_ = *puVar1;
    auVar48._0_8_ = *(undefined8 *)(top + 8);
    auVar34 = psadbw((undefined1  [16])0x0,auVar48);
    uVar29 = auVar34._8_4_ + auVar34._0_4_ + 8;
    uVar30 = uVar29 >> 4;
    bVar4 = (byte)(uVar29 >> 0x18);
    uVar45 = (undefined1)(uVar30 >> 0x10);
    uVar44 = (undefined1)(uVar30 >> 8);
    auVar39._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(bVar4 >> 4,bVar4 >> 4),uVar45),CONCAT14(uVar45,uVar30)) >>
              0x20);
    auVar39[3] = uVar44;
    auVar39[2] = uVar44;
    auVar39[0] = (undefined1)uVar30;
    auVar39[1] = auVar39[0];
    auVar39._8_8_ = 0;
    auVar34 = pshuflw(auVar39,auVar39,0);
    lVar33 = 0;
    do {
      *(long *)(dst + lVar33 + 0x408) = auVar34._0_8_;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  if (top == (uint8_t *)0x0) {
    lVar33 = 0;
    do {
      builtin_memcpy(dst + lVar33 + 0x508,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  else {
    uVar5 = *(undefined8 *)(top + 8);
    lVar33 = 0;
    do {
      *(undefined8 *)(dst + lVar33 + 0x508) = uVar5;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  puVar31 = dst + 0x518;
  if (left == (uint8_t *)0x0) {
    lVar33 = 0;
    do {
      puVar2 = puVar31 + lVar33;
      puVar2[0] = 0x81;
      puVar2[1] = 0x81;
      puVar2[2] = 0x81;
      puVar2[3] = 0x81;
      puVar2[4] = 0x81;
      puVar2[5] = 0x81;
      puVar2[6] = 0x81;
      puVar2[7] = 0x81;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0x100);
  }
  else {
    lVar33 = 0;
    do {
      auVar34 = ZEXT216(CONCAT11(*(undefined1 *)((long)puVar32 + lVar33),
                                 *(undefined1 *)((long)puVar32 + lVar33)));
      auVar34 = pshuflw(auVar34,auVar34,0);
      *(long *)puVar31 = auVar34._0_8_;
      puVar31 = puVar31 + 0x20;
      lVar33 = lVar33 + 1;
    } while (lVar33 != 8);
  }
  puVar31 = dst + 0x418;
  if (left == (uint8_t *)0x0) {
    if (top == (uint8_t *)0x0) {
      lVar33 = 0;
      do {
        puVar2 = puVar31 + lVar33;
        puVar2[0] = 0x81;
        puVar2[1] = 0x81;
        puVar2[2] = 0x81;
        puVar2[3] = 0x81;
        puVar2[4] = 0x81;
        puVar2[5] = 0x81;
        puVar2[6] = 0x81;
        puVar2[7] = 0x81;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
    else {
      uVar5 = *(undefined8 *)(top + 8);
      lVar33 = 0;
      do {
        *(undefined8 *)(puVar31 + lVar33) = uVar5;
        lVar33 = lVar33 + 0x20;
      } while (lVar33 != 0x100);
    }
  }
  else if (top == (uint8_t *)0x0) {
    lVar33 = 0;
    do {
      auVar34 = ZEXT216(CONCAT11(*(undefined1 *)((long)puVar32 + lVar33),
                                 *(undefined1 *)((long)puVar32 + lVar33)));
      auVar34 = pshuflw(auVar34,auVar34,0);
      *(long *)puVar31 = auVar34._0_8_;
      puVar31 = puVar31 + 0x20;
      lVar33 = lVar33 + 1;
    } while (lVar33 != 8);
  }
  else {
    uVar3 = *(ulong *)(top + 8);
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar3;
    auVar7[0xe] = (char)(uVar3 >> 0x38);
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar3;
    auVar9[0xc] = (char)(uVar3 >> 0x30);
    auVar9._13_2_ = auVar7._13_2_;
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar3;
    auVar11._12_3_ = auVar9._12_3_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar3;
    auVar13[10] = (char)(uVar3 >> 0x28);
    auVar13._11_4_ = auVar11._11_4_;
    auVar15._8_2_ = 0;
    auVar15._0_8_ = uVar3;
    auVar15._10_5_ = auVar13._10_5_;
    auVar17[8] = (char)(uVar3 >> 0x20);
    auVar17._0_8_ = uVar3;
    auVar17._9_6_ = auVar15._9_6_;
    auVar22._7_8_ = 0;
    auVar22._0_7_ = auVar17._8_7_;
    Var19 = CONCAT81(SUB158(auVar22 << 0x40,7),(char)(uVar3 >> 0x18));
    auVar27._9_6_ = 0;
    auVar27._0_9_ = Var19;
    auVar23._1_10_ = SUB1510(auVar27 << 0x30,5);
    auVar23[0] = (char)(uVar3 >> 0x10);
    auVar28._11_4_ = 0;
    auVar28._0_11_ = auVar23;
    auVar24._1_12_ = SUB1512(auVar28 << 0x20,3);
    auVar24[0] = (char)(uVar3 >> 8);
    bVar4 = left[0xf];
    lVar33 = 0;
    do {
      auVar34 = ZEXT416((uint)*(byte *)((long)puVar32 + lVar33) - (uint)bVar4);
      auVar34 = pshuflw(auVar34,auVar34,0);
      sVar54 = auVar34._0_2_;
      sVar46 = sVar54 + (ushort)(byte)uVar3;
      sVar55 = auVar34._2_2_;
      sVar49 = sVar55 + auVar24._0_2_;
      sVar50 = sVar54 + auVar23._0_2_;
      sVar51 = sVar55 + (short)Var19;
      sVar52 = sVar54 + auVar17._8_2_;
      sVar53 = sVar55 + auVar13._10_2_;
      sVar54 = sVar54 + auVar9._12_2_;
      sVar55 = sVar55 + (auVar7._13_2_ >> 8);
      *(ulong *)puVar31 =
           CONCAT17((0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55),
                    CONCAT16((0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54),
                             CONCAT15((0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 -
                                      (0xff < sVar53),
                                      CONCAT14((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 -
                                               (0xff < sVar52),
                                               CONCAT13((0 < sVar51) * (sVar51 < 0x100) *
                                                        (char)sVar51 - (0xff < sVar51),
                                                        CONCAT12((0 < sVar50) * (sVar50 < 0x100) *
                                                                 (char)sVar50 - (0xff < sVar50),
                                                                 CONCAT11((0 < sVar49) *
                                                                          (sVar49 < 0x100) *
                                                                          (char)sVar49 -
                                                                          (0xff < sVar49),
                                                                          (0 < sVar46) *
                                                                          (sVar46 < 0x100) *
                                                                          (char)sVar46 -
                                                                          (0xff < sVar46))))))));
      lVar33 = lVar33 + 1;
      puVar31 = puVar31 + 0x20;
    } while (lVar33 != 8);
  }
  return;
}

Assistant:

static WEBP_INLINE void DC8uvMode_SSE2(uint8_t* WEBP_RESTRICT dst,
                                       const uint8_t* WEBP_RESTRICT left,
                                       const uint8_t* WEBP_RESTRICT top) {
  if (top != NULL) {
    if (left != NULL) {  // top and left present
      DC8uv_SSE2(dst, left, top);
    } else {  // top, but no left
      DC8uvNoLeft_SSE2(dst, top);
    }
  } else if (left != NULL) {  // left but no top
    DC8uvNoTop_SSE2(dst, left);
  } else {  // no top, no left, nothing.
    DC8uvNoTopLeft_SSE2(dst);
  }
}